

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void __thiscall ObjectBlockPool<8,_8192>::CollectUnmarked(ObjectBlockPool<8,_8192> *this)

{
  SmallBlock<8> **ppSVar1;
  ulong uVar2;
  uint newSize;
  FastVector<SmallBlock<8>_*,_false,_false> *this_00;
  SmallBlock<8> *pSVar3;
  SmallBlock<8> *pSVar4;
  ulong uVar5;
  SmallBlock<8> *local_48;
  FastVector<SmallBlock<8>_*,_false,_false> *local_40;
  FastVector<SmallBlock<8>_*,_false,_false> *local_38;
  
  pSVar3 = (SmallBlock<8> *)this->activePages;
  if (pSVar3 != (SmallBlock<8> *)0x0) {
    local_38 = &this->objectsToFree;
    local_40 = &this->objectsToFinalize;
    do {
      if ((pSVar3 != (SmallBlock<8> *)this->activePages) || (this->lastNum != 0)) {
        uVar5 = 0;
        pSVar4 = pSVar3;
        do {
          pSVar4 = pSVar4 + 1;
          if ((pSVar4->marker & 3) == 0) {
            if (((uint)pSVar4->marker & 0xc) == 4) {
              newSize = (this->objectsToFinalize).count;
              this_00 = local_40;
              if (newSize != (this->objectsToFinalize).max) {
                ppSVar1 = (this->objectsToFinalize).data;
                (this->objectsToFinalize).count = newSize + 1;
LAB_00121214:
                ppSVar1[newSize] = pSVar4;
                goto LAB_00121218;
              }
            }
            else {
              newSize = (this->objectsToFree).count;
              this_00 = local_38;
              if (newSize != (this->objectsToFree).max) {
                ppSVar1 = (this->objectsToFree).data;
                (this->objectsToFree).count = newSize + 1;
                goto LAB_00121214;
              }
            }
            local_48 = pSVar4;
            FastVector<SmallBlock<8>_*,_false,_false>::grow_and_add(this_00,newSize,&local_48);
          }
LAB_00121218:
          uVar5 = uVar5 + 1;
          uVar2 = (ulong)this->lastNum;
          if (pSVar3 != (SmallBlock<8> *)this->activePages) {
            uVar2 = 0x2000;
          }
        } while (uVar5 < uVar2);
      }
      pSVar3 = (SmallBlock<8> *)pSVar3[0x2001].marker;
    } while (pSVar3 != (SmallBlock<8> *)0x0);
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}